

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

size_t portability_path_get_directory_inplace(char *path,size_t size)

{
  size_t last;
  size_t i;
  size_t size_local;
  char *path_local;
  size_t local_8;
  
  if (path == (char *)0x0) {
    local_8 = 0;
  }
  else {
    last = 0;
    for (i = 0; path[i] != '\0' && i < size; i = i + 1) {
      if (path[i] == '/') {
        last = i + 1;
      }
    }
    path[last] = '\0';
    local_8 = last + 1;
  }
  return local_8;
}

Assistant:

size_t portability_path_get_directory_inplace(char *path, size_t size)
{
	if (path == NULL)
	{
		return 0;
	}

	size_t i, last;

	for (i = 0, last = 0; path[i] != '\0' && i < size; ++i)
	{
		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			last = i + 1;
		}
	}

	path[last] = '\0';

	return last + 1;
}